

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

int __thiscall QFSFileEngine::copy(QFSFileEngine *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QAbstractFileEnginePrivate *pQVar1;
  bool bVar2;
  undefined7 extraout_var;
  long in_FS_OFFSET;
  QSystemError local_70;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  local_70.errorCode = 0;
  local_70.errorScope = NoError;
  QFileSystemEntry::QFileSystemEntry(&local_68,(QString *)dst);
  bVar2 = QFileSystemEngine::copyFile((QFileSystemEntry *)(pQVar1 + 1),&local_68,&local_70);
  QFileSystemEntry::~QFileSystemEntry(&local_68);
  if (!bVar2) {
    QSystemError::toString(&local_68.m_filePath,&local_70);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,CopyError,&local_68.m_filePath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::copy(const QString &copyName)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::copyFile(d->fileEntry, QFileSystemEntry(copyName), error);
    if (!ret)
        setError(QFile::CopyError, error.toString());
    return ret;
}